

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O2

ggml_tensor * __thiscall
llm_graph_context::build_moe_ffn
          (llm_graph_context *this,ggml_tensor *cur,ggml_tensor *gate_inp,ggml_tensor *up_exps,
          ggml_tensor *gate_exps,ggml_tensor *down_exps,ggml_tensor *exp_probs_b,int64_t n_expert,
          int64_t n_expert_used,llm_ffn_op_type type_op,bool norm_w,bool scale_w,float w_scale,
          llama_expert_gating_func_type gating_op,int il)

{
  llm_arch lVar1;
  int64_t iVar2;
  int64_t iVar3;
  ggml_context *pgVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  ggml_tensor *pgVar7;
  undefined8 uVar8;
  ggml_tensor *pgVar9;
  ggml_tensor *pgVar10;
  char *name;
  long lVar11;
  long lVar12;
  
  iVar2 = cur->ne[0];
  iVar3 = cur->ne[1];
  lVar1 = this->arch;
  pgVar5 = build_lora_mm(this,gate_inp,cur);
  cb(this,pgVar5,"ffn_moe_logits",il);
  if (gating_op == LLAMA_EXPERT_GATING_FUNC_TYPE_SIGMOID) {
    pgVar6 = (ggml_tensor *)ggml_sigmoid(this->ctx0,pgVar5);
  }
  else {
    if (gating_op != LLAMA_EXPERT_GATING_FUNC_TYPE_SOFTMAX) {
      uVar8 = 0x35d;
      goto LAB_001ec812;
    }
    pgVar6 = (ggml_tensor *)ggml_soft_max(this->ctx0,pgVar5);
  }
  cb(this,pgVar6,"ffn_moe_probs",il);
  pgVar7 = pgVar6;
  if (exp_probs_b != (ggml_tensor *)0x0) {
    pgVar7 = (ggml_tensor *)ggml_add(this->ctx0,pgVar6);
    cb(this,pgVar7,"ffn_moe_probs_biased",il);
  }
  if (this->arch == LLM_ARCH_LLAMA4) {
    pgVar7 = pgVar5;
  }
  pgVar5 = (ggml_tensor *)ggml_top_k(this->ctx0,pgVar7,n_expert_used);
  cb(this,pgVar5->src[0],"ffn_moe_argsort",il);
  cb(this,pgVar5,"ffn_moe_topk",il);
  pgVar4 = this->ctx0;
  uVar8 = ggml_reshape_3d(pgVar4,pgVar6,1,n_expert,iVar3);
  pgVar6 = (ggml_tensor *)ggml_get_rows(pgVar4,uVar8,pgVar5);
  cb(this,pgVar6,"ffn_moe_weights",il);
  if (norm_w) {
    uVar8 = ggml_reshape_2d(this->ctx0,pgVar6,n_expert_used,iVar3);
    pgVar6 = (ggml_tensor *)ggml_sum_rows(this->ctx0,uVar8);
    cb(this,pgVar6,"ffn_moe_weights_sum",il);
    pgVar6 = (ggml_tensor *)ggml_div(this->ctx0,uVar8,pgVar6);
    cb(this,pgVar6,"ffn_moe_weights_norm",il);
    pgVar6 = (ggml_tensor *)ggml_reshape_3d(this->ctx0,pgVar6,1,n_expert_used,iVar3);
  }
  if (scale_w) {
    pgVar6 = (ggml_tensor *)ggml_scale(w_scale,this->ctx0,pgVar6);
    cb(this,pgVar6,"ffn_moe_weights_scaled",il);
  }
  pgVar7 = (ggml_tensor *)ggml_reshape_3d(this->ctx0,cur,iVar2,1,iVar3);
  if (lVar1 == LLM_ARCH_LLAMA4) {
    uVar8 = ggml_new_tensor_3d(this->ctx0,pgVar7->type,iVar2,n_expert_used,iVar3);
    uVar8 = ggml_repeat(this->ctx0,pgVar7,uVar8);
    pgVar7 = (ggml_tensor *)ggml_mul(this->ctx0,uVar8,pgVar6);
    cb(this,pgVar7,"ffn_moe_weighted",il);
  }
  pgVar9 = build_lora_mm_id(this,up_exps,pgVar7,pgVar5);
  cb(this,pgVar9,"ffn_moe_up",il);
  pgVar10 = build_lora_mm_id(this,gate_exps,pgVar7,pgVar5);
  cb(this,pgVar10,"ffn_moe_gate",il);
  if (type_op == LLM_FFN_GELU) {
    pgVar10 = (ggml_tensor *)ggml_gelu(this->ctx0,pgVar10);
    name = "ffn_moe_gelu";
  }
  else {
    if (type_op != LLM_FFN_SILU) {
      uVar8 = 0x3a4;
LAB_001ec812:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                 ,uVar8,"fatal error");
    }
    pgVar10 = (ggml_tensor *)ggml_silu(this->ctx0,pgVar10);
    name = "ffn_moe_silu";
  }
  cb(this,pgVar10,name,il);
  pgVar9 = (ggml_tensor *)ggml_mul(this->ctx0,pgVar9,pgVar10);
  cb(this,pgVar9,"ffn_moe_gate_par",il);
  pgVar5 = build_lora_mm_id(this,down_exps,pgVar9,pgVar5);
  cb(this,pgVar5,"ffn_moe_down",il);
  if (lVar1 != LLM_ARCH_LLAMA4) {
    pgVar5 = (ggml_tensor *)ggml_mul(this->ctx0,pgVar5,pgVar6);
    cb(this,pgVar7,"ffn_moe_weighted",il);
  }
  lVar11 = 0;
  lVar12 = 0;
  if (0 < n_expert_used) {
    lVar12 = n_expert_used;
  }
  pgVar6 = (ggml_tensor *)0x0;
  for (; lVar12 != lVar11; lVar11 = lVar11 + 1) {
    pgVar7 = (ggml_tensor *)
             ggml_view_2d(this->ctx0,pgVar5,iVar2,iVar3,pgVar5->nb[2],pgVar5->nb[1] * lVar11);
    if (lVar11 != 0) {
      pgVar7 = (ggml_tensor *)ggml_add(this->ctx0,pgVar6,pgVar7);
    }
    pgVar6 = pgVar7;
  }
  if (n_expert_used == 1) {
    pgVar6 = (ggml_tensor *)ggml_cont(this->ctx0,pgVar6);
  }
  cb(this,pgVar6,"ffn_moe_out",il);
  return pgVar6;
}

Assistant:

ggml_tensor * llm_graph_context::build_moe_ffn(
         ggml_tensor * cur,
         ggml_tensor * gate_inp,
         ggml_tensor * up_exps,
         ggml_tensor * gate_exps,
         ggml_tensor * down_exps,
         ggml_tensor * exp_probs_b,
             int64_t   n_expert,
             int64_t   n_expert_used,
     llm_ffn_op_type   type_op,
                bool   norm_w,
                bool   scale_w,
               float   w_scale,
         llama_expert_gating_func_type gating_op,
                 int   il) const {
    const int64_t n_embd   = cur->ne[0];
    const int64_t n_tokens = cur->ne[1];
    const bool weight_before_ffn = arch == LLM_ARCH_LLAMA4; // for llama4, we apply the sigmoid-ed weights before the FFN

    ggml_tensor * logits = build_lora_mm(gate_inp, cur); // [n_expert, n_tokens]
    cb(logits, "ffn_moe_logits", il);

    ggml_tensor * probs = nullptr;
    switch (gating_op) {
        case LLAMA_EXPERT_GATING_FUNC_TYPE_SOFTMAX:
            {
                probs = ggml_soft_max(ctx0, logits); // [n_expert, n_tokens]
            } break;
        case LLAMA_EXPERT_GATING_FUNC_TYPE_SIGMOID:
            {
                probs = ggml_sigmoid(ctx0, logits); // [n_expert, n_tokens]
            } break;
        default:
            GGML_ABORT("fatal error");
    }
    cb(probs, "ffn_moe_probs", il);

    // add experts selection bias - introduced in DeepSeek V3
    // leave probs unbiased as it's later used to get expert weights
    ggml_tensor * selection_probs = probs;
    if (exp_probs_b != nullptr) {
        selection_probs = ggml_add(ctx0, probs, exp_probs_b);
        cb(selection_probs, "ffn_moe_probs_biased", il);
    }

    // llama4 doesn't have exp_probs_b, and sigmoid is only used after top_k
    // see: https://github.com/meta-llama/llama-models/blob/699a02993512fb36936b1b0741e13c06790bcf98/models/llama4/moe.py#L183-L198
    if (arch == LLM_ARCH_LLAMA4) {
        selection_probs = logits;
    }

    // select experts
    ggml_tensor * selected_experts = ggml_top_k(ctx0, selection_probs, n_expert_used); // [n_expert_used, n_tokens]
    cb(selected_experts->src[0], "ffn_moe_argsort", il);
    cb(selected_experts, "ffn_moe_topk", il);

    ggml_tensor * weights = ggml_get_rows(ctx0,
            ggml_reshape_3d(ctx0, probs, 1, n_expert, n_tokens), selected_experts); // [1, n_expert_used, n_tokens]
    cb(weights, "ffn_moe_weights", il);

    if (norm_w) {
        weights = ggml_reshape_2d(ctx0, weights, n_expert_used, n_tokens);

        ggml_tensor * weights_sum = ggml_sum_rows(ctx0, weights); // [1, n_tokens]
        cb(weights_sum, "ffn_moe_weights_sum", il);

        weights = ggml_div(ctx0, weights, weights_sum); // [n_expert_used, n_tokens]
        cb(weights, "ffn_moe_weights_norm", il);

        weights = ggml_reshape_3d(ctx0, weights, 1, n_expert_used, n_tokens);
    }
    if (scale_w) {
        weights = ggml_scale(ctx0, weights, w_scale);
        cb(weights, "ffn_moe_weights_scaled", il);
    }

    cur = ggml_reshape_3d(ctx0, cur, n_embd, 1, n_tokens);

    if (weight_before_ffn) {
        // TODO: this is a workaround as we don't yet have a repeat op that takes custom dim (ggml_repeat_4d)
        ggml_tensor * repeated = ggml_new_tensor_3d(ctx0, cur->type, n_embd, n_expert_used, n_tokens);
        repeated = ggml_repeat(ctx0, cur, repeated); // [n_embd, n_expert_used, n_tokens]
        cur = ggml_mul(ctx0, repeated, weights);
        cb(cur, "ffn_moe_weighted", il);
    }

    ggml_tensor * up = build_lora_mm_id(up_exps, cur, selected_experts); // [n_ff, n_expert_used, n_tokens]
    cb(up, "ffn_moe_up", il);

    ggml_tensor * gate = build_lora_mm_id(gate_exps, cur, selected_experts); // [n_ff, n_expert_used, n_tokens]
    cb(gate, "ffn_moe_gate", il);

    switch (type_op) {
        case LLM_FFN_SILU:
            {
                gate = ggml_silu(ctx0, gate);
                cb(gate, "ffn_moe_silu", il);
            } break;
        case LLM_FFN_GELU:
            {
                gate = ggml_gelu(ctx0, gate);
                cb(gate, "ffn_moe_gelu", il);
            } break;
        default:
            GGML_ABORT("fatal error");
    }

    ggml_tensor * par = ggml_mul(ctx0, up, gate); // [n_ff, n_expert_used, n_tokens]
    cb(par, "ffn_moe_gate_par", il);

    ggml_tensor * experts = build_lora_mm_id(down_exps, par, selected_experts); // [n_embd, n_expert_used, n_tokens]
    cb(experts, "ffn_moe_down", il);

    if (!weight_before_ffn) {
        experts = ggml_mul(ctx0, experts, weights);
        cb(cur, "ffn_moe_weighted", il);
    }

    // aggregate experts
    ggml_tensor * moe_out = nullptr;
    for (int i = 0; i < n_expert_used; ++i) {
        ggml_tensor * cur_expert = ggml_view_2d(ctx0, experts, n_embd, n_tokens,
                experts->nb[2], i*experts->nb[1]);

        if (i == 0) {
            moe_out = cur_expert;
        } else {
            moe_out = ggml_add(ctx0, moe_out, cur_expert);
        }
    }

    if (n_expert_used == 1) {
        // avoid returning a non-contiguous tensor
        moe_out = ggml_cont(ctx0, moe_out);
    }

    cb(moe_out, "ffn_moe_out", il);

    return moe_out;
}